

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractInvariantTest_ThatMultipleConditionsAndInvariantsResultOnlyInASingleInvariantCall_Test::
TestBody(ContractInvariantTest_ThatMultipleConditionsAndInvariantsResultOnlyInASingleInvariantCall_Test
         *this)

{
  undefined1 uVar1;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  TestClassMultipleConditionsAndInvariant sut;
  TestClassMultipleConditionsAndInvariant *in_stack_00000100;
  AssertHelper *this_00;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_20;
  AssertHelper local_10 [2];
  
  this_00 = local_10;
  anon_unknown.dwarf_114b::TestClassMultipleConditionsAndInvariant::
  TestClassMultipleConditionsAndInvariant((TestClassMultipleConditionsAndInvariant *)0x1428f8);
  anon_unknown.dwarf_114b::TestClassMultipleConditionsAndInvariant::dummy1(in_stack_00000100);
  this_01 = &local_20;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),(int *)this_01,
             (int *)this_00);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x142979);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffb0));
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1429c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x142a05);
  return;
}

Assistant:

TEST(ContractInvariantTest, ThatMultipleConditionsAndInvariantsResultOnlyInASingleInvariantCall)
{
  TestClassMultipleConditionsAndInvariant sut;
  sut.dummy1();
  EXPECT_EQ(1, sut.invariantCalled);

}